

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O2

void blake2s256_64(void *key,int len,uint32_t seed,void *out)

{
  uchar buf [32];
  
  blake2s_init(&ltc_state,0x20,(uchar *)0x0,0);
  ltc_state.blake2s.h[0] = seed ^ 0x6a09e667;
  blake2s_process(&ltc_state,(uchar *)key,(long)len);
  blake2s_done(&ltc_state,buf);
  *(undefined8 *)out = buf._0_8_;
  return;
}

Assistant:

inline void blake2s256_64(const void * key, int len, uint32_t seed, void * out)
{
  // objsize
  unsigned char buf[32];
  blake2s_init(&ltc_state, 32, NULL, 0);
  ltc_state.blake2s.h[0] = 0x6A09E667UL ^ seed;
  blake2s_process(&ltc_state, (unsigned char *)key, len);
  blake2s_done(&ltc_state, buf);
  memcpy(out, buf, 8);
}